

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O1

BufferHandle *
duckdb::PhysicalRangeJoin::SliceSortedPayload
          (BufferHandle *__return_storage_ptr__,DataChunk *payload,GlobalSortState *state,
          idx_t block_idx,SelectionVector *result,idx_t result_count,idx_t left_cols)

{
  reference pvVar1;
  type sd;
  data_ptr_t pdVar2;
  ulong uVar3;
  SelectionVector *row_sel;
  reference col;
  ulong uVar4;
  idx_t count;
  long lVar5;
  idx_t iVar6;
  ulong uVar7;
  SelectionVector gsel;
  LogicalType local_158;
  SBScanState read_state;
  Vector addresses;
  
  SBScanState::SBScanState(&read_state,state->buffer_manager,state);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
           ::operator[](&state->sorted_blocks,0);
  read_state.sb =
       (pvVar1->super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
       _M_t.super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
       .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
  sd = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator*
                 (&(read_state.sb)->payload_data);
  SBScanState::SetIndices(&read_state,block_idx,0);
  SBScanState::PinData(&read_state,sd);
  pdVar2 = SBScanState::DataPtr(&read_state,sd);
  LogicalType::LogicalType(&local_158,POINTER);
  Vector::Vector(&addresses,&local_158,result_count);
  LogicalType::~LogicalType(&local_158);
  if (result->sel_vector == (uint *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (ulong)*result->sel_vector;
  }
  iVar6 = (sd->layout).row_width;
  SelectionVector::SelectionVector(&gsel,result_count);
  *gsel.sel_vector = 0;
  *(data_ptr_t *)addresses.data = pdVar2 + uVar7 * iVar6;
  count = 1;
  if (1 < result_count) {
    uVar3 = 1;
    lVar5 = 0;
    do {
      uVar4 = uVar3;
      if (result->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)result->sel_vector[uVar3];
      }
      if (uVar4 != uVar7) {
        *(data_ptr_t *)(addresses.data + lVar5 * 8 + 8) = pdVar2 + uVar4 * iVar6;
        lVar5 = lVar5 + 1;
        uVar7 = uVar4;
      }
      gsel.sel_vector[uVar3] = (sel_t)lVar5;
      uVar3 = uVar3 + 1;
    } while (result_count != uVar3);
    count = lVar5 + 1;
  }
  if (((sd->layout).all_constant == false) && (state->external == true)) {
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&read_state.payload_heap_handle.node);
    pdVar2 = (read_state.payload_heap_handle.node.ptr)->buffer;
  }
  else {
    pdVar2 = (data_ptr_t)0x0;
  }
  row_sel = FlatVector::IncrementalSelectionVector();
  if ((sd->layout).types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (sd->layout).types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar6 = 0;
    do {
      col = vector<duckdb::Vector,_true>::operator[](&payload->data,left_cols + iVar6);
      RowOperations::Gather(&addresses,row_sel,col,row_sel,count,&sd->layout,iVar6,0,pdVar2);
      Vector::Slice(col,&gsel,result_count);
      iVar6 = iVar6 + 1;
    } while (iVar6 < (ulong)(((long)(sd->layout).types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(sd->layout).types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  BufferHandle::BufferHandle(__return_storage_ptr__,&read_state.payload_heap_handle);
  if (gsel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (gsel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (addresses.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (addresses.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (addresses.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (addresses.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (addresses.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (addresses.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&addresses.type);
  BufferHandle::~BufferHandle(&read_state.payload_heap_handle);
  BufferHandle::~BufferHandle(&read_state.payload_data_handle);
  BufferHandle::~BufferHandle(&read_state.blob_sorting_heap_handle);
  BufferHandle::~BufferHandle(&read_state.blob_sorting_data_handle);
  BufferHandle::~BufferHandle(&read_state.radix_handle);
  return __return_storage_ptr__;
}

Assistant:

BufferHandle PhysicalRangeJoin::SliceSortedPayload(DataChunk &payload, GlobalSortState &state, const idx_t block_idx,
                                                   const SelectionVector &result, const idx_t result_count,
                                                   const idx_t left_cols) {
	// There should only be one sorted block if they have been sorted
	D_ASSERT(state.sorted_blocks.size() == 1);
	SBScanState read_state(state.buffer_manager, state);
	read_state.sb = state.sorted_blocks[0].get();
	auto &sorted_data = *read_state.sb->payload_data;

	read_state.SetIndices(block_idx, 0);
	read_state.PinData(sorted_data);
	const auto data_ptr = read_state.DataPtr(sorted_data);
	data_ptr_t heap_ptr = nullptr;

	// Set up a batch of pointers to scan data from
	Vector addresses(LogicalType::POINTER, result_count);
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);

	// Set up the data pointers for the values that are actually referenced
	const idx_t &row_width = sorted_data.layout.GetRowWidth();

	auto prev_idx = result.get_index(0);
	SelectionVector gsel(result_count);
	idx_t addr_count = 0;
	gsel.set_index(0, addr_count);
	data_pointers[addr_count] = data_ptr + prev_idx * row_width;
	for (idx_t i = 1; i < result_count; ++i) {
		const auto row_idx = result.get_index(i);
		if (row_idx != prev_idx) {
			data_pointers[++addr_count] = data_ptr + row_idx * row_width;
			prev_idx = row_idx;
		}
		gsel.set_index(i, addr_count);
	}
	++addr_count;

	// Unswizzle the offsets back to pointers (if needed)
	if (!sorted_data.layout.AllConstant() && state.external) {
		heap_ptr = read_state.payload_heap_handle.Ptr();
	}

	// Deserialize the payload data
	auto sel = FlatVector::IncrementalSelectionVector();
	for (idx_t col_no = 0; col_no < sorted_data.layout.ColumnCount(); col_no++) {
		auto &col = payload.data[left_cols + col_no];
		RowOperations::Gather(addresses, *sel, col, *sel, addr_count, sorted_data.layout, col_no, 0, heap_ptr);
		col.Slice(gsel, result_count);
	}

	return std::move(read_state.payload_heap_handle);
}